

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O0

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,int64_t size,complex<float> value)

{
  int64_t size_local;
  SquareMatrix<std::complex<float>_> *this_local;
  complex<float> value_local;
  
  this->size_ = size;
  init_unique_array<std::complex<float>>((dense *)&this->data_,size * size,value);
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x35,
                "qclab::dense::SquareMatrix<std::complex<float>>::SquareMatrix(const int64_t, const T) [T = std::complex<float>]"
               );
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }